

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select.hpp
# Opt level: O0

Gen<char> * __thiscall
rc::gen::oneOf<char,char>
          (Gen<char> *__return_storage_ptr__,gen *this,Gen<char> *gen,Gen<char> *gens)

{
  Gen<char> local_88;
  Gen<char> local_60;
  OneOfGen<char> local_38;
  Gen<char> *local_20;
  Gen<char> *gens_local;
  Gen<char> *gen_local;
  
  local_20 = gen;
  gens_local = (Gen<char> *)this;
  gen_local = __return_storage_ptr__;
  Gen<char>::Gen(&local_60,(Gen<char> *)this);
  Gen<char>::Gen(&local_88,gen);
  detail::OneOfGen<char>::OneOfGen<char,char>(&local_38,&local_60,&local_88);
  Gen<char>::Gen<rc::gen::detail::OneOfGen<char>,void>(__return_storage_ptr__,&local_38);
  detail::OneOfGen<char>::~OneOfGen(&local_38);
  Gen<char>::~Gen(&local_88);
  Gen<char>::~Gen(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Gen<T> oneOf(Gen<T> gen, Gen<Ts>... gens) {
  return detail::OneOfGen<T>(std::move(gen), std::move(gens)...);
}